

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::selectRow(QAccessibleTable *this,int row)

{
  char cVar1;
  SelectionBehavior SVar2;
  SelectionMode SVar3;
  int iVar4;
  QAbstractItemView *pQVar5;
  QAbstractItemModel *pQVar6;
  QAbstractItemView *pQVar7;
  QItemSelectionModel *pQVar8;
  bool bVar9;
  long in_FS_OFFSET;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QAbstractItemView *)view(this);
  pQVar6 = QAbstractItemView::model(pQVar5);
  if (pQVar6 != (QAbstractItemModel *)0x0) {
    pQVar7 = (QAbstractItemView *)view(this);
    pQVar8 = QAbstractItemView::selectionModel(pQVar7);
    if (pQVar8 != (QItemSelectionModel *)0x0) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QModelIndex *)&local_58,pQVar5);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = -0x55555556;
      iStack_74 = -0x55555556;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,row,0,(QModelIndex *)&local_58);
      bVar9 = false;
      if (((local_78 < 0) || (bVar9 = false, iStack_74 < 0)) || (local_68 == (undefined1 *)0x0))
      goto LAB_004da06d;
      pQVar7 = (QAbstractItemView *)view(this);
      SVar2 = QAbstractItemView::selectionBehavior(pQVar7);
      if (SVar2 != SelectColumns) {
        pQVar7 = (QAbstractItemView *)view(this);
        SVar3 = QAbstractItemView::selectionMode(pQVar7);
        if (SVar3 != NoSelection) {
          if (SVar3 == ContiguousSelection) {
            if (row != 0) {
              pQVar8 = QAbstractItemView::selectionModel(pQVar5);
              cVar1 = QItemSelectionModel::isRowSelected
                                ((int)pQVar8,(QModelIndex *)(ulong)(row - 1));
              if (cVar1 != '\0') goto LAB_004da12c;
            }
            pQVar8 = QAbstractItemView::selectionModel(pQVar5);
            cVar1 = QItemSelectionModel::isRowSelected((int)pQVar8,(QModelIndex *)(ulong)(row + 1));
            if (cVar1 == '\0') goto LAB_004da124;
          }
          else if (SVar3 == SingleSelection) {
            pQVar5 = (QAbstractItemView *)view(this);
            SVar2 = QAbstractItemView::selectionBehavior(pQVar5);
            if (SVar2 != SelectRows) {
              iVar4 = (**(code **)(*(long *)this + 0x58))(this);
              if (1 < iVar4) goto LAB_004da06b;
            }
            pQVar5 = (QAbstractItemView *)view(this);
LAB_004da124:
            QAbstractItemView::clearSelection(pQVar5);
          }
LAB_004da12c:
          pQVar5 = (QAbstractItemView *)view(this);
          pQVar8 = QAbstractItemView::selectionModel(pQVar5);
          (**(code **)(*(long *)pQVar8 + 0x68))(pQVar8,&local_78,0x22);
          bVar9 = true;
          goto LAB_004da06d;
        }
      }
    }
  }
LAB_004da06b:
  bVar9 = false;
LAB_004da06d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::selectRow(int row)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel || !view()->selectionModel())
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, 0, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectColumns)
        return false;

    switch (view()->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (view()->selectionBehavior() != QAbstractItemView::SelectRows && columnCount() > 1 )
            return false;
        view()->clearSelection();
        break;
    case QAbstractItemView::ContiguousSelection:
        if ((!row || !theView->selectionModel()->isRowSelected(row - 1, rootIndex))
            && !theView->selectionModel()->isRowSelected(row + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    view()->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return true;
}